

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O0

string * __thiscall arangodb::velocypack::HexDump::toString_abi_cxx11_(HexDump *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  int current;
  uint8_t *e;
  uint8_t *p;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  string *__res;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar2;
  pointer local_30;
  
  __res = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          in_RSI->_M_string_length;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&in_RSI->field_2 + 8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),(size_type)__res);
  local_30 = (in_RSI->_M_dataplus)._M_p;
  pcVar1 = local_30 + in_RSI->_M_string_length;
  iVar2 = 0;
  while (local_30 < pcVar1) {
    if (((iVar2 != 0) &&
        (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                   (in_RSI,__str), 0 < *(int *)&in_RSI->field_2)) &&
       (iVar2 == *(int *)&in_RSI->field_2)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (in_RSI,(char)((ulong)__str >> 0x38));
      iVar2 = 0;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_RSI,__str);
    local_30 = local_30 + 1;
    appendHex((string *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),(uint8_t)((ulong)__res >> 0x38));
    iVar2 = iVar2 + 1;
  }
  return in_RDI;
}

Assistant:

std::string HexDump::toString() const {
  std::string result;
  result.reserve(4 * (length + separator.size()) + (length / valuesPerLine) +
                 1);

  uint8_t const* p = data;
  uint8_t const* e = p + length;
  int current = 0;
  while (p < e) {
    if (current != 0) {
      result.append(separator);

      if (valuesPerLine > 0 && current == valuesPerLine) {
        result.push_back('\n');
        current = 0;
      }
    }

    result.append(header);
    appendHex(result, *p++);
    ++current;
  }

  return result;
}